

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O1

Vec_Int_t *
Gia_ManMaxiTest(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int nTimeOut,int fSim,
               int fVerbose)

{
  int iVar1;
  Vec_Int_t *vInit;
  int *__s;
  Vec_Int_t *pVVar2;
  int iVar3;
  
  vInit = vInit0;
  if (vInit0 == (Vec_Int_t *)0x0) {
    iVar1 = p->nRegs;
    vInit = (Vec_Int_t *)malloc(0x10);
    iVar3 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar3 = iVar1;
    }
    vInit->nSize = 0;
    vInit->nCap = iVar3;
    if (iVar3 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar3 << 2);
    }
    vInit->pArray = __s;
    vInit->nSize = iVar1;
    memset(__s,0,(long)iVar1 << 2);
  }
  pVVar2 = Gia_ManMaxiPerform(p,vInit,nFrames,nTimeOut,fVerbose);
  if (vInit != vInit0) {
    if (vInit->pArray != (int *)0x0) {
      free(vInit->pArray);
      vInit->pArray = (int *)0x0;
    }
    free(vInit);
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_ManMaxiTest( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vRes, * vInit;
    vInit = vInit0 ? vInit0 : Vec_IntStart( Gia_ManRegNum(p) );
    vRes = Gia_ManMaxiPerform( p, vInit, nFrames, nTimeOut, fVerbose );
    if ( vInit != vInit0 )
        Vec_IntFree( vInit );
    return vRes;
}